

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O1

REF_STATUS
ref_grid_tri_qua_id_nodes
          (REF_GRID ref_grid,REF_INT cell_id,REF_INT *nnode,REF_INT *ncell,REF_INT **g2l,
          REF_INT **l2g)

{
  REF_NODE pRVar1;
  REF_CELL pRVar2;
  REF_INT *pRVar3;
  bool bVar4;
  REF_STATUS RVar5;
  REF_INT *pRVar6;
  long lVar7;
  char *pcVar8;
  REF_STATUS unaff_R15D;
  int iVar9;
  REF_INT nodes [27];
  REF_INT local_a8 [30];
  
  pRVar1 = ref_grid->node;
  if ((long)pRVar1->max < 0) {
    unaff_R15D = 1;
    pcVar8 = "malloc *g2l of REF_INT negative";
  }
  else {
    pRVar6 = (REF_INT *)malloc((long)pRVar1->max << 2);
    *g2l = pRVar6;
    if (pRVar6 != (REF_INT *)0x0) {
      bVar4 = true;
      if (0 < pRVar1->max) {
        lVar7 = 0;
        do {
          pRVar6[lVar7] = -1;
          lVar7 = lVar7 + 1;
        } while (lVar7 < pRVar1->max);
      }
      goto LAB_00166e4c;
    }
    unaff_R15D = 2;
    pcVar8 = "malloc *g2l of REF_INT NULL";
  }
  bVar4 = false;
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x18a,
         "ref_grid_tri_qua_id_nodes",pcVar8);
LAB_00166e4c:
  if (bVar4) {
    iVar9 = 0;
    *nnode = 0;
    *ncell = 0;
    pRVar2 = ref_grid->cell[3];
    if (0 < pRVar2->max) {
      do {
        RVar5 = ref_cell_nodes(pRVar2,iVar9,local_a8);
        if (((RVar5 == 0) && (local_a8[pRVar2->node_per] == cell_id)) &&
           (*ncell = *ncell + 1, 0 < pRVar2->node_per)) {
          pRVar6 = *g2l;
          lVar7 = 0;
          do {
            if (pRVar6[local_a8[lVar7]] == -1) {
              pRVar6[local_a8[lVar7]] = *nnode;
              *nnode = *nnode + 1;
            }
            lVar7 = lVar7 + 1;
          } while (lVar7 < pRVar2->node_per);
        }
        iVar9 = iVar9 + 1;
      } while (iVar9 < pRVar2->max);
    }
    pRVar2 = ref_grid->cell[6];
    if (0 < pRVar2->max) {
      iVar9 = 0;
      do {
        RVar5 = ref_cell_nodes(pRVar2,iVar9,local_a8);
        if (((RVar5 == 0) && (local_a8[pRVar2->node_per] == cell_id)) &&
           (*ncell = *ncell + 1, 0 < pRVar2->node_per)) {
          pRVar6 = *g2l;
          lVar7 = 0;
          do {
            if (pRVar6[local_a8[lVar7]] == -1) {
              pRVar6[local_a8[lVar7]] = *nnode;
              *nnode = *nnode + 1;
            }
            lVar7 = lVar7 + 1;
          } while (lVar7 < pRVar2->node_per);
        }
        iVar9 = iVar9 + 1;
      } while (iVar9 < pRVar2->max);
    }
    if ((long)*nnode < 0) {
      unaff_R15D = 1;
      pcVar8 = "malloc *l2g of REF_INT negative";
    }
    else {
      pRVar6 = (REF_INT *)malloc((long)*nnode << 2);
      *l2g = pRVar6;
      if (pRVar6 != (REF_INT *)0x0) {
        *nnode = 0;
        if (0 < pRVar1->max) {
          pRVar3 = *g2l;
          lVar7 = 0;
          do {
            if (pRVar3[lVar7] != -1) {
              pRVar3[lVar7] = *nnode;
              iVar9 = *nnode;
              pRVar6[iVar9] = (REF_INT)lVar7;
              *nnode = iVar9 + 1;
            }
            lVar7 = lVar7 + 1;
          } while (lVar7 < pRVar1->max);
        }
        return 0;
      }
      unaff_R15D = 2;
      pcVar8 = "malloc *l2g of REF_INT NULL";
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x1a9,
           "ref_grid_tri_qua_id_nodes",pcVar8);
  }
  return unaff_R15D;
}

Assistant:

REF_FCN REF_STATUS ref_grid_tri_qua_id_nodes(REF_GRID ref_grid, REF_INT cell_id,
                                             REF_INT *nnode, REF_INT *ncell,
                                             REF_INT **g2l, REF_INT **l2g) {
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_INT cell, node, cell_node;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];

  ref_node = ref_grid_node(ref_grid);

  ref_malloc_init(*g2l, ref_node_max(ref_node), REF_INT, REF_EMPTY);

  (*nnode) = 0;
  (*ncell) = 0;

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (cell_id == nodes[ref_cell_id_index(ref_cell)]) {
      (*ncell)++;
      each_ref_cell_cell_node(ref_cell, cell_node) {
        if (REF_EMPTY == (*g2l)[nodes[cell_node]]) {
          (*g2l)[nodes[cell_node]] = (*nnode);
          (*nnode)++;
        }
      }
    }
  }

  ref_cell = ref_grid_qua(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (cell_id == nodes[ref_cell_id_index(ref_cell)]) {
      (*ncell)++;
      each_ref_cell_cell_node(ref_cell, cell_node) {
        if (REF_EMPTY == (*g2l)[nodes[cell_node]]) {
          (*g2l)[nodes[cell_node]] = (*nnode);
          (*nnode)++;
        }
      }
    }
  }

  ref_malloc(*l2g, *nnode, REF_INT);

  (*nnode) = 0;
  for (node = 0; node < ref_node_max(ref_node); node++) {
    if (REF_EMPTY != (*g2l)[node]) {
      (*g2l)[node] = (*nnode);
      (*l2g)[(*nnode)] = node;
      (*nnode)++;
    }
  }

  return REF_SUCCESS;
}